

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall RandStrCatList::RandStrCatList(RandStrCatList *this,RandStrParser *p)

{
  RandStrNode *pRVar1;
  wchar_t wVar2;
  RandStrRepeat *this_00;
  RandStrNode **ppRVar3;
  
  (this->super_RandStrNode).nextSibling = (RandStrNode *)0x0;
  (this->super_RandStrNode).firstChild = (RandStrNode *)0x0;
  (this->super_RandStrNode).lastChild = (RandStrNode *)0x0;
  (this->super_RandStrNode)._vptr_RandStrNode = (_func_int **)&PTR__RandStrNode_00359050;
  while( true ) {
    if (p->rem == 0) {
      return;
    }
    wVar2 = RandStrParser::getch(p);
    if (wVar2 == L')') break;
    wVar2 = RandStrParser::getch(p);
    if (wVar2 == L'|') {
      return;
    }
    this_00 = (RandStrRepeat *)operator_new(0x28);
    RandStrRepeat::RandStrRepeat(this_00,p);
    pRVar1 = (this->super_RandStrNode).lastChild;
    ppRVar3 = &pRVar1->nextSibling;
    if (pRVar1 == (RandStrNode *)0x0) {
      ppRVar3 = &(this->super_RandStrNode).firstChild;
    }
    *ppRVar3 = (RandStrNode *)this_00;
    (this->super_RandStrNode).lastChild = (RandStrNode *)this_00;
  }
  return;
}

Assistant:

RandStrCatList(RandStrParser *p)
    {
        /* 
         *   parse repeat groups until we reach the end of the string, the
         *   end of the alternative, or the end of the parenthesized group 
         */
        while (p->more() && p->getch() != ')' && p->getch() != '|')
            addChild(new RandStrRepeat(p));
    }